

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int freePage2(BtShared *pBt,MemPage *pMemPage,Pgno iPage)

{
  i16 *piVar1;
  MemPage *pMVar2;
  u8 *puVar3;
  DbPage *pDVar4;
  MemPage *pMVar5;
  int iVar6;
  u32 uVar7;
  u32 uVar8;
  Bitvec *p;
  uint uVar9;
  int local_44;
  MemPage *pTrunk;
  MemPage *local_38;
  
  pTrunk = (MemPage *)0x0;
  pMVar2 = pBt->pPage1;
  if (pMemPage == (MemPage *)0x0) {
    pMemPage = btreePageLookup(pBt,iPage);
  }
  else {
    piVar1 = &pMemPage->pDbPage->nRef;
    *piVar1 = *piVar1 + 1;
  }
  local_38 = pMemPage;
  iVar6 = sqlite3PagerWrite(pMVar2->pDbPage);
  local_44 = iVar6;
  if (iVar6 == 0) {
    puVar3 = pMVar2->aData;
    uVar7 = sqlite3Get4byte(puVar3 + 0x24);
    uVar9 = uVar7 + 1;
    *(uint *)(puVar3 + 0x24) =
         uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 * 0x1000000;
    if ((pBt->btsFlags & 4) == 0) {
LAB_0013aec9:
      if ((pBt->autoVacuum == '\0') ||
         (ptrmapPut(pBt,iPage,'\x02',0,&local_44), iVar6 = local_44, local_44 == 0)) {
        if (uVar7 == 0) {
          uVar7 = 0;
LAB_0013afaf:
          if ((pMemPage != (MemPage *)0x0) ||
             (iVar6 = btreeGetPage(pBt,iPage,&local_38,0,0), pMemPage = local_38, iVar6 == 0)) {
            iVar6 = sqlite3PagerWrite(pMemPage->pDbPage);
            if (iVar6 == 0) {
              *(u32 *)pMemPage->aData =
                   uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
              puVar3 = pMemPage->aData;
              puVar3[4] = '\0';
              puVar3[5] = '\0';
              puVar3[6] = '\0';
              puVar3[7] = '\0';
              *(Pgno *)(pMVar2->aData + 0x20) =
                   iPage >> 0x18 | (iPage & 0xff0000) >> 8 | (iPage & 0xff00) << 8 | iPage << 0x18;
              iVar6 = 0;
            }
            goto LAB_0013ae6f;
          }
        }
        else {
          uVar7 = sqlite3Get4byte(pMVar2->aData + 0x20);
          iVar6 = btreeGetPage(pBt,uVar7,&pTrunk,0,0);
          pMVar5 = pTrunk;
          if (iVar6 == 0) {
            uVar8 = sqlite3Get4byte(pTrunk->aData + 4);
            uVar9 = pBt->usableSize >> 2;
            if (uVar9 - 2 < uVar8) {
              sqlite3CorruptError(0xd65b);
              iVar6 = 0xb;
            }
            else {
              if (uVar9 - 8 <= uVar8) goto LAB_0013afaf;
              iVar6 = sqlite3PagerWrite(pMVar5->pDbPage);
              if (iVar6 == 0) {
                uVar9 = uVar8 + 1;
                *(uint *)(pMVar5->aData + 4) =
                     uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                     uVar9 * 0x1000000;
                *(Pgno *)(pMVar5->aData + (uVar8 * 4 + 8)) =
                     iPage >> 0x18 | (iPage & 0xff0000) >> 8 | (iPage & 0xff00) << 8 | iPage << 0x18
                ;
                if ((pMemPage != (MemPage *)0x0) && ((pBt->btsFlags & 4) == 0)) {
                  pDVar4 = pMemPage->pDbPage;
                  if (((pDVar4->flags & 2) != 0) && (pDVar4->pPager->nSavepoint == 0)) {
                    pDVar4->flags = pDVar4->flags | 0x20;
                  }
                }
                p = pBt->pHasContent;
                if (p == (Bitvec *)0x0) {
                  p = sqlite3BitvecCreate(pBt->nPage);
                  pBt->pHasContent = p;
                  if (p == (Bitvec *)0x0) {
                    iVar6 = 7;
                    goto LAB_0013ae66;
                  }
                }
                iVar6 = 0;
                if (iPage <= p->iSize) {
                  iVar6 = sqlite3BitvecSet(p,iPage);
                }
              }
            }
          }
        }
      }
      goto LAB_0013ae66;
    }
    if ((pMemPage == (MemPage *)0x0) &&
       (iVar6 = btreeGetPage(pBt,iPage,&local_38,0,0), pMemPage = local_38, iVar6 != 0))
    goto LAB_0013ae66;
    iVar6 = sqlite3PagerWrite(pMemPage->pDbPage);
    local_44 = iVar6;
    if (iVar6 == 0) {
      memset(pMemPage->aData,0,(ulong)pMemPage->pBt->pageSize);
      goto LAB_0013aec9;
    }
  }
  else {
LAB_0013ae66:
    if (pMemPage == (MemPage *)0x0) {
      pMemPage = (MemPage *)0x0;
      goto LAB_0013af61;
    }
  }
LAB_0013ae6f:
  pMemPage->isInit = '\0';
LAB_0013af61:
  releasePage(pMemPage);
  releasePage(pTrunk);
  return iVar6;
}

Assistant:

static int freePage2(BtShared *pBt, MemPage *pMemPage, Pgno iPage){
  MemPage *pTrunk = 0;                /* Free-list trunk page */
  Pgno iTrunk = 0;                    /* Page number of free-list trunk page */ 
  MemPage *pPage1 = pBt->pPage1;      /* Local reference to page 1 */
  MemPage *pPage;                     /* Page being freed. May be NULL. */
  int rc;                             /* Return Code */
  int nFree;                          /* Initial number of pages on free-list */

  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( iPage>1 );
  assert( !pMemPage || pMemPage->pgno==iPage );

  if( pMemPage ){
    pPage = pMemPage;
    sqlite3PagerRef(pPage->pDbPage);
  }else{
    pPage = btreePageLookup(pBt, iPage);
  }

  /* Increment the free page count on pPage1 */
  rc = sqlite3PagerWrite(pPage1->pDbPage);
  if( rc ) goto freepage_out;
  nFree = get4byte(&pPage1->aData[36]);
  put4byte(&pPage1->aData[36], nFree+1);

  if( pBt->btsFlags & BTS_SECURE_DELETE ){
    /* If the secure_delete option is enabled, then
    ** always fully overwrite deleted information with zeros.
    */
    if( (!pPage && ((rc = btreeGetPage(pBt, iPage, &pPage, 0, 0))!=0) )
     ||            ((rc = sqlite3PagerWrite(pPage->pDbPage))!=0)
    ){
      goto freepage_out;
    }
    memset(pPage->aData, 0, pPage->pBt->pageSize);
  }

  /* If the database supports auto-vacuum, write an entry in the pointer-map
  ** to indicate that the page is free.
  */
  if( ISAUTOVACUUM ){
    ptrmapPut(pBt, iPage, PTRMAP_FREEPAGE, 0, &rc);
    if( rc ) goto freepage_out;
  }

  /* Now manipulate the actual database free-list structure. There are two
  ** possibilities. If the free-list is currently empty, or if the first
  ** trunk page in the free-list is full, then this page will become a
  ** new free-list trunk page. Otherwise, it will become a leaf of the
  ** first trunk page in the current free-list. This block tests if it
  ** is possible to add the page as a new free-list leaf.
  */
  if( nFree!=0 ){
    u32 nLeaf;                /* Initial number of leaf cells on trunk page */

    iTrunk = get4byte(&pPage1->aData[32]);
    rc = btreeGetPage(pBt, iTrunk, &pTrunk, 0, 0);
    if( rc!=SQLITE_OK ){
      goto freepage_out;
    }

    nLeaf = get4byte(&pTrunk->aData[4]);
    assert( pBt->usableSize>32 );
    if( nLeaf > (u32)pBt->usableSize/4 - 2 ){
      rc = SQLITE_CORRUPT_BKPT;
      goto freepage_out;
    }
    if( nLeaf < (u32)pBt->usableSize/4 - 8 ){
      /* In this case there is room on the trunk page to insert the page
      ** being freed as a new leaf.
      **
      ** Note that the trunk page is not really full until it contains
      ** usableSize/4 - 2 entries, not usableSize/4 - 8 entries as we have
      ** coded.  But due to a coding error in versions of SQLite prior to
      ** 3.6.0, databases with freelist trunk pages holding more than
      ** usableSize/4 - 8 entries will be reported as corrupt.  In order
      ** to maintain backwards compatibility with older versions of SQLite,
      ** we will continue to restrict the number of entries to usableSize/4 - 8
      ** for now.  At some point in the future (once everyone has upgraded
      ** to 3.6.0 or later) we should consider fixing the conditional above
      ** to read "usableSize/4-2" instead of "usableSize/4-8".
      */
      rc = sqlite3PagerWrite(pTrunk->pDbPage);
      if( rc==SQLITE_OK ){
        put4byte(&pTrunk->aData[4], nLeaf+1);
        put4byte(&pTrunk->aData[8+nLeaf*4], iPage);
        if( pPage && (pBt->btsFlags & BTS_SECURE_DELETE)==0 ){
          sqlite3PagerDontWrite(pPage->pDbPage);
        }
        rc = btreeSetHasContent(pBt, iPage);
      }
      TRACE(("FREE-PAGE: %d leaf on trunk page %d\n",pPage->pgno,pTrunk->pgno));
      goto freepage_out;
    }
  }

  /* If control flows to this point, then it was not possible to add the
  ** the page being freed as a leaf page of the first trunk in the free-list.
  ** Possibly because the free-list is empty, or possibly because the 
  ** first trunk in the free-list is full. Either way, the page being freed
  ** will become the new first trunk page in the free-list.
  */
  if( pPage==0 && SQLITE_OK!=(rc = btreeGetPage(pBt, iPage, &pPage, 0, 0)) ){
    goto freepage_out;
  }
  rc = sqlite3PagerWrite(pPage->pDbPage);
  if( rc!=SQLITE_OK ){
    goto freepage_out;
  }
  put4byte(pPage->aData, iTrunk);
  put4byte(&pPage->aData[4], 0);
  put4byte(&pPage1->aData[32], iPage);
  TRACE(("FREE-PAGE: %d new trunk page replacing %d\n", pPage->pgno, iTrunk));

freepage_out:
  if( pPage ){
    pPage->isInit = 0;
  }
  releasePage(pPage);
  releasePage(pTrunk);
  return rc;
}